

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genCaseIdentifiers_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  string *psVar1;
  long *plVar2;
  size_t sVar3;
  TDNode *pTVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  string returnString;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string *local_38;
  
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x03');
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_78 = &local_68;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar2[3];
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_38 = __return_storage_ptr__;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  uVar11 = 0;
  while( true ) {
    sVar3 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar3 <= uVar11) break;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,'\x06');
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x2b2de1);
    local_98 = &local_88;
    puVar7 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar7) {
      local_88 = *puVar7;
      lStack_80 = plVar2[3];
    }
    else {
      local_88 = *puVar7;
      local_98 = (ulong *)*plVar2;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)puVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pTVar4 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar11);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(pTVar4->_name)._M_dataplus._M_p);
    local_d8 = &local_c8;
    puVar7 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar7) {
      local_c8 = *puVar7;
      lStack_c0 = plVar2[3];
    }
    else {
      local_c8 = *puVar7;
      local_d8 = (ulong *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)puVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    puVar8 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar8) {
      local_a8 = *puVar8;
      uStack_a0 = puVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar8;
      local_b8 = (undefined8 *)*puVar5;
    }
    local_b0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    uVar11 = uVar11 + 1;
  }
  lVar10 = 8;
  uVar11 = 0;
  while( true ) {
    sVar3 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar3 <= uVar11) break;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,'\x06');
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x2b2de1);
    local_98 = &local_88;
    puVar7 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar7) {
      local_88 = *puVar7;
      lStack_80 = puVar5[3];
    }
    else {
      local_88 = *puVar7;
      local_98 = (ulong *)*puVar5;
    }
    local_90 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_98,*(ulong *)((long)this->viewName + lVar10 + -8));
    local_d8 = &local_c8;
    puVar7 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar7) {
      local_c8 = *puVar7;
      lStack_c0 = puVar5[3];
    }
    else {
      local_c8 = *puVar7;
      local_d8 = (ulong *)*puVar5;
    }
    local_d0 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    puVar8 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar8) {
      local_a8 = *puVar8;
      uStack_a0 = puVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar8;
      local_b8 = (undefined8 *)*puVar5;
    }
    local_b0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x20;
  }
  std::__cxx11::string::pop_back();
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_78,local_70 + (long)local_78);
  std::__cxx11::string::append((char *)&local_d8);
  psVar1 = local_38;
  local_98 = &local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,'\x03');
  uVar11 = 0xf;
  if (local_d8 != &local_c8) {
    uVar11 = local_c8;
  }
  if (uVar11 < (ulong)(local_90 + local_d0)) {
    uVar11 = 0xf;
    if (local_98 != &local_88) {
      uVar11 = local_88;
    }
    if ((ulong)(local_90 + local_d0) <= uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
      goto LAB_001fbe70;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98);
LAB_001fbe70:
  puVar8 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar8) {
    local_a8 = *puVar8;
    uStack_a0 = puVar5[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar8;
    local_b8 = (undefined8 *)*puVar5;
  }
  local_b0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar9 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar9) {
    lVar10 = plVar2[3];
    (psVar1->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&psVar1->field_2 + 8) = lVar10;
  }
  else {
    (psVar1->_M_dataplus)._M_p = (pointer)*plVar2;
    (psVar1->field_2)._M_allocated_capacity = *psVar9;
  }
  psVar1->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar9;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return psVar1;
}

Assistant:

std::string CppGenerator::genCaseIdentifiers()
{
    std::string returnString = offset(1)+"enum ID {";

    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        returnString += "\n"+offset(2)+_td->getRelation(rel)->_name+"_ID,";

    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
        returnString += "\n"+offset(2)+viewName[view]+"_ID,";
    returnString.pop_back();

    return returnString+"\n"+offset(1)+"};\n";
}